

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall
Corrade::Utility::String::Implementation::anon_unknown_12::uppercaseInPlaceImplementation::
anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this,char *data,size_t size)

{
  char *local_30;
  char *c;
  char *end;
  size_t size_local;
  char *data_local;
  anon_class_1_0_00000001 *this_local;
  
  for (local_30 = data; local_30 != data + size; local_30 = local_30 + 1) {
    *local_30 = *local_30 + ((byte)(*local_30 + 0x9fU) < 0x1a) * -0x20;
  }
  return;
}

Assistant:

CORRADE_UTILITY_CPU_MAYBE_UNUSED typename std::decay<decltype(lowercaseInPlace)>::type uppercaseInPlaceImplementation(Cpu::ScalarT) {
  return [](char* data, const std::size_t size) {
    /* Same as above, except that (1 << 5) is subtracted for 'a' and all 26
       letters after. */
    const char* const end = data + size;
    for(char* c = data; c != end; ++c)
        *c -= (std::uint8_t(*c - 'a') < 26) << 5;
  };
}